

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O0

Am_Wrapper * return_move_inter_proc(Am_Object *self)

{
  bool bVar1;
  Am_Object local_28;
  Am_Object local_20;
  Am_Object mover;
  Am_Object *self_local;
  
  mover.data = (Am_Object_Data *)self;
  Am_Object::Am_Object(&local_20);
  Am_Object::Get_Sibling(&local_28,(Am_Slot_Key)mover.data,0x1da);
  Am_Object::operator=(&local_20,&local_28);
  Am_Object::~Am_Object(&local_28);
  bVar1 = Am_Object::Valid(&local_20);
  if (bVar1) {
    self_local = (Am_Object *)Am_Object::operator_cast_to_Am_Wrapper_(&local_20);
  }
  else {
    self_local = (Am_Object *)0x0;
  }
  Am_Object::~Am_Object(&local_20);
  return (Am_Wrapper *)self_local;
}

Assistant:

Am_Define_Value_List_Formula(return_move_inter)
{
  Am_Object mover;
  mover = self.Get_Sibling(Am_MOVE_INTERACTOR);
  if (mover.Valid())
    return mover;
  else
    return nullptr;
}